

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O1

int flvtag_addcaption_scc(flvtag_t *tag,scc_t *scc)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  sei_t sei;
  sei_t local_30;
  
  pbVar1 = tag->data;
  uVar3 = 0;
  if ((((*pbVar1 & 0x1f) == 9) && (uVar3 = 0, (pbVar1[0xb] & 0xf) == 7)) && (pbVar1[0xc] == 1)) {
    uVar3 = (uint)pbVar1[0xf] | (uint)pbVar1[0xe] << 8 | (uint)pbVar1[0xd] << 0x10;
  }
  sei_init(&local_30,
           (double)(((uint)pbVar1[5] << 8 | (uint)pbVar1[7] << 0x18 | (uint)pbVar1[4] << 0x10 |
                    (uint)pbVar1[6]) + uVar3));
  sei_from_scc(&local_30,scc);
  iVar2 = flvtag_addsei(tag,&local_30);
  sei_free(&local_30);
  return iVar2;
}

Assistant:

int flvtag_addcaption_scc(flvtag_t* tag, const scc_t* scc)
{
    sei_t sei;
    sei_init(&sei, flvtag_pts(tag));
    sei_from_scc(&sei, scc);
    int ret = flvtag_addsei(tag, &sei);
    sei_free(&sei);
    return ret;
}